

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

bool Potassco::parseSigned(char **x,longlong *out,longlong sMin,longlong sMax)

{
  char *pcVar1;
  int iVar2;
  longlong lVar3;
  int *piVar4;
  bool bVar5;
  char *err;
  
  pcVar1 = *x;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
LAB_00117ade:
    bVar5 = false;
  }
  else {
    iVar2 = strncmp(pcVar1,"imax",4);
    lVar3 = sMax;
    if ((iVar2 == 0) || (iVar2 = strncmp(pcVar1,"imin",4), lVar3 = sMin, iVar2 == 0)) {
      *out = lVar3;
      *x = pcVar1 + 4;
    }
    else {
      iVar2 = detectBase(pcVar1);
      lVar3 = strtoll(pcVar1,&err,iVar2);
      *out = lVar3;
      if ((lVar3 + 0x8000000000000001U < 2) && (piVar4 = __errno_location(), *piVar4 == 0x22)) {
        *piVar4 = 0;
        pcVar1 = *x;
        iVar2 = detectBase(pcVar1);
        lVar3 = strtoll(pcVar1,(char **)0x0,iVar2);
        if (*piVar4 == 0x22) {
          return false;
        }
        if (*out != lVar3) {
          return false;
        }
      }
      if ((err == *x) || (sMax < lVar3 || lVar3 < sMin)) goto LAB_00117ade;
      *x = err;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

static bool parseSigned(const char*& x, long long& out, long long sMin, long long sMax) {
	if (!x || !*x) {
		return false;
	}
	if ((std::strncmp(x, "imax", 4) == 0 && (out = sMax) != 0) || (std::strncmp(x, "imin", 4) == 0 && (out = sMin) != 0)) {
		x += 4;
		return true;
	}
	char* err;
	out = strtoll(x, &err, detectBase(x));
	if ((out == LLONG_MAX || out == LLONG_MIN) && errno == ERANGE) {
		errno = 0;
		long long temp = strtoll(x, 0, detectBase(x));
		if (errno == ERANGE || out != temp) {
			return false;
		}
	}
	if (err == x || out < sMin || out > sMax) {
		return false;
	}
	x = err;
	return true;
}